

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

void BinaryenCallIndirectSetTable(BinaryenExpressionRef expr,char *table)

{
  IString *this;
  undefined1 in_CL;
  string_view sVar1;
  
  this = (IString *)strlen(table);
  sVar1._M_str = (char *)0x0;
  sVar1._M_len = (size_t)table;
  sVar1 = wasm::IString::interned(this,sVar1,(bool)in_CL);
  if (expr->_id == CallIndirectId) {
    *(string_view *)(expr + 4) = sVar1;
    return;
  }
  __assert_fail("expression->is<CallIndirect>()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0x90b,"void BinaryenCallIndirectSetTable(BinaryenExpressionRef, const char *)");
}

Assistant:

void BinaryenCallIndirectSetTable(BinaryenExpressionRef expr,
                                  const char* table) {
  Name name(table);
  auto* expression = (Expression*)expr;

  assert(expression->is<CallIndirect>());
  static_cast<CallIndirect*>(expression)->table = name;
}